

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# px_config.c
# Opt level: O0

int katherine_px_config_load_bpc_data(katherine_px_config_t *px_config,katherine_bpc_t *bpc)

{
  int iVar1;
  int iVar2;
  int local_38;
  int i;
  uchar val;
  uchar *src;
  uint32_t *dest;
  int y;
  int x;
  katherine_bpc_t *bpc_local;
  katherine_px_config_t *px_config_local;
  
  memset(px_config,0,0x10000);
  for (local_38 = 0; local_38 < 0x10000; local_38 = local_38 + 1) {
    iVar1 = 0xff - local_38 / 0x100;
    iVar2 = (local_38 % 0x100) * 0x40 + (iVar1 >> 2);
    px_config->words[iVar2] =
         (uint)(byte)(bpc->px_config[local_38] & 0x21 |
                     katherine_px_config_load_bpc_data::reverse_array
                     [(int)(bpc->px_config[local_38] & 0x1e) >> 1] << 1) <<
         (('\x03' - (char)(iVar1 % 4)) * '\b' & 0x1fU) | px_config->words[iVar2];
  }
  return 0;
}

Assistant:

int
katherine_px_config_load_bpc_data(katherine_px_config_t *px_config, const katherine_bpc_t *bpc)
{
    // Reset the pixel values.
    memset(&px_config->words, 0, 65536);

    int x, y;
    uint32_t *dest = (uint32_t*) px_config->words;
    const unsigned char *src = (const unsigned char *) bpc->px_config;
    static unsigned char reverse_array[] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
    unsigned char val;

    for (int i = 0; i < 65536; ++i) {
        y = i / 256;
        x = i % 256;
        val = (unsigned char) ((src[i] & 0x21) | (reverse_array[((src[i] & 0x1E) >> 1)] << 1));

        y = 255 - y;
        dest[(64 * x) + (y >> 2)] |= (uint32_t) (val << (8 * (3 - (y % 4))));
    }

    return 0;
}